

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_reader_extract_file_to_mem_no_alloc
                  (mz_zip_archive *pZip,char *pFilename,void *pBuf,size_t buf_size,mz_uint flags,
                  void *pUser_read_buf,size_t user_read_buf_size)

{
  mz_bool mVar1;
  mz_bool mVar2;
  undefined8 in_RAX;
  mz_uint32 file_index;
  
  file_index = (mz_uint32)((ulong)in_RAX >> 0x20);
  mVar2 = 0;
  mVar1 = mz_zip_reader_locate_file_v2(pZip,pFilename,(char *)0x0,flags,&file_index);
  if (mVar1 != 0) {
    mVar2 = mz_zip_reader_extract_to_mem_no_alloc1
                      (pZip,file_index,pBuf,buf_size,flags,pUser_read_buf,user_read_buf_size,
                       (mz_zip_archive_file_stat *)0x0);
  }
  return mVar2;
}

Assistant:

mz_bool mz_zip_reader_extract_file_to_mem_no_alloc(
    mz_zip_archive *pZip, const char *pFilename, void *pBuf, size_t buf_size,
    mz_uint flags, void *pUser_read_buf, size_t user_read_buf_size) {
  mz_uint32 file_index;
  if (!mz_zip_reader_locate_file_v2(pZip, pFilename, NULL, flags, &file_index))
    return MZ_FALSE;
  return mz_zip_reader_extract_to_mem_no_alloc1(pZip, file_index, pBuf,
                                                buf_size, flags, pUser_read_buf,
                                                user_read_buf_size, NULL);
}